

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spscqueue.cpp
# Opt level: O0

int write_proc(void)

{
  int step;
  int in_stack_0000000c;
  spsc_queue<int> *in_stack_00000010;
  undefined4 local_4;
  
  while (g_index <= g_maxCount) {
    local_4 = rand_step();
    while (0 < local_4) {
      local_4 = local_4 + -1;
      g_index = g_index + 1;
      spsc_queue<int>::enqueue(in_stack_00000010,in_stack_0000000c);
    }
    usleep(1);
  }
  return 0;
}

Assistant:

int write_proc()
{

    while( g_index <= g_maxCount)
    {
	int step = rand_step(); 
	Log( " enqueue "<< step<< " to queue " ); 
	while(step  > 0)
	{
	    step--; 

	    {
		q.enqueue(g_index++); 
	    }
	}
	usleep(1); 
    }
    Log(" write finished " ); 

    return 0; 

}